

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O2

void __thiscall
Nova::Parse_Args::Add_Double_Argument
          (Parse_Args *this,string *arg_str,double default_value,string *val_name,string *desc)

{
  Arg_Data AStack_148;
  
  Arg_Data::Arg_Data(&AStack_148,arg_str,val_name,desc,default_value);
  std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::emplace_back<Nova::Arg_Data>
            (&this->arg_data_list,&AStack_148);
  Arg_Data::~Arg_Data(&AStack_148);
  return;
}

Assistant:

void Parse_Args::
Add_Double_Argument(const std::string& arg_str,double default_value,const std::string& val_name,const std::string& desc)
{
    arg_data_list.push_back(Arg_Data(arg_str,val_name,desc,default_value));
}